

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_stream.c
# Opt level: O2

uint64_t al_get_audio_stream_played_samples(ALLEGRO_AUDIO_STREAM *stream)

{
  ALLEGRO_MUTEX *mutex;
  uint64_t uVar1;
  
  mutex = (stream->spl).mutex;
  maybe_lock_mutex(mutex);
  if ((stream->spl).spl_data.buffer.f32 == (float *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = (long)(stream->spl).pos + (long)(stream->spl).spl_data.len * stream->consumed_fragments;
  }
  maybe_unlock_mutex(mutex);
  return uVar1;
}

Assistant:

uint64_t al_get_audio_stream_played_samples(const ALLEGRO_AUDIO_STREAM *stream)
{
   uint64_t result;
   ALLEGRO_MUTEX *stream_mutex;
   ASSERT(stream);

   stream_mutex = maybe_lock_mutex(stream->spl.mutex);
   if (stream->spl.spl_data.buffer.ptr) {
      result = stream->consumed_fragments * stream->spl.spl_data.len +
         stream->spl.pos;
   }
   else {
      result = 0;
   }
   maybe_unlock_mutex(stream_mutex);

   return result;
}